

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

uint8_t * ures_getBinary_63(UResourceBundle *resB,int32_t *len,UErrorCode *status)

{
  uint8_t *puVar1;
  UErrorCode UVar2;
  
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resB == (UResourceBundle *)0x0) {
      UVar2 = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      puVar1 = res_getBinary_63(&resB->fResData,resB->fRes,len);
      if (puVar1 != (uint8_t *)0x0) {
        return puVar1;
      }
      UVar2 = U_RESOURCE_TYPE_MISMATCH;
    }
    *status = UVar2;
  }
  return (uint8_t *)0x0;
}

Assistant:

U_CAPI const uint8_t* U_EXPORT2 ures_getBinary(const UResourceBundle* resB, int32_t* len, 
                                               UErrorCode*               status) {
  const uint8_t *p;
  if (status==NULL || U_FAILURE(*status)) {
    return NULL;
  }
  if(resB == NULL) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return NULL;
  }
  p = res_getBinary(&(resB->fResData), resB->fRes, len);
  if (p == NULL) {
    *status = U_RESOURCE_TYPE_MISMATCH;
  }
  return p;
}